

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_genc.cpp
# Opt level: O0

void writeAssemblyCode(char *filename,char *destdir,char *optEntryPoint,char *optFilename,
                      char *outFilePath)

{
  int32_t iVar1;
  int iVar2;
  FileStream *fileStream;
  FileStream *fileStream_00;
  size_t sVar3;
  ulong uVar4;
  size_t length;
  size_t i;
  FileStream *out;
  FileStream *in;
  char *bufferStr;
  uint32_t buffer [1024];
  char entry [64];
  uint32_t local_3c;
  uint32_t column;
  char *outFilePath_local;
  char *optFilename_local;
  char *optEntryPoint_local;
  char *destdir_local;
  char *filename_local;
  
  local_3c = 0xffffffff;
  fileStream = T_FileStream_open(filename,"rb");
  if (fileStream == (FileStream *)0x0) {
    fprintf(_stderr,"genccode: unable to open input file %s\n",filename);
    exit(4);
  }
  getOutFilename(filename,destdir,(char *)&bufferStr,(char *)(buffer + 0x3fe),".S",optFilename);
  fileStream_00 = T_FileStream_open((char *)&bufferStr,"w");
  if (fileStream_00 != (FileStream *)0x0) {
    if (outFilePath != (char *)0x0) {
      strcpy(outFilePath,(char *)&bufferStr);
    }
    if (optEntryPoint != (char *)0x0) {
      strcpy((char *)(buffer + 0x3fe),optEntryPoint);
      strcat((char *)(buffer + 0x3fe),"_dat");
    }
    sVar3 = strlen((char *)(buffer + 0x3fe));
    for (length = 0; length < sVar3; length = length + 1) {
      if ((*(char *)((long)buffer + length + 0xff8) == '-') ||
         (*(char *)((long)buffer + length + 0xff8) == '.')) {
        *(undefined1 *)((long)buffer + length + 0xff8) = 0x5f;
      }
    }
    sprintf((char *)&bufferStr,assemblyHeader[assemblyHeaderIndex].header,buffer + 0x3fe,
            buffer + 0x3fe,buffer + 0x3fe,buffer + 0x3fe,buffer + 0x3fe,buffer + 0x3fe,
            buffer + 0x3fe,buffer + 0x3fe);
    T_FileStream_writeLine(fileStream_00,(char *)&bufferStr);
    T_FileStream_writeLine(fileStream_00,assemblyHeader[assemblyHeaderIndex].beginLine);
    while( true ) {
      iVar1 = T_FileStream_read(fileStream,&bufferStr,0x1000);
      uVar4 = (ulong)iVar1;
      if (uVar4 == 0) break;
      if (uVar4 != 0x1000) {
        for (length = 0; length < (uVar4 & 3); length = length + 1) {
          buffer[uVar4 + length + -2] = 0;
        }
      }
      for (length = 0; length < uVar4 >> 2; length = length + 1) {
        local_3c = write32(fileStream_00,buffer[length - 2],local_3c);
      }
    }
    T_FileStream_writeLine(fileStream_00,"\n");
    sprintf((char *)&bufferStr,assemblyHeader[assemblyHeaderIndex].footer,buffer + 0x3fe,
            buffer + 0x3fe,buffer + 0x3fe,buffer + 0x3fe,buffer + 0x3fe,buffer + 0x3fe,
            buffer + 0x3fe,buffer + 0x3fe);
    T_FileStream_writeLine(fileStream_00,(char *)&bufferStr);
    iVar2 = T_FileStream_error(fileStream);
    if (iVar2 == 0) {
      iVar2 = T_FileStream_error(fileStream_00);
      if (iVar2 == 0) {
        T_FileStream_close(fileStream_00);
        T_FileStream_close(fileStream);
        return;
      }
      fprintf(_stderr,"genccode: file write error while generating from file %s\n",filename);
      exit(4);
    }
    fprintf(_stderr,"genccode: file read error while generating from file %s\n",filename);
    exit(4);
  }
  fprintf(_stderr,"genccode: unable to open output file %s\n",&bufferStr);
  exit(4);
}

Assistant:

U_CAPI void U_EXPORT2
writeAssemblyCode(const char *filename, const char *destdir, const char *optEntryPoint, const char *optFilename, char *outFilePath) {
    uint32_t column = MAX_COLUMN;
    char entry[64];
    uint32_t buffer[1024];
    char *bufferStr = (char *)buffer;
    FileStream *in, *out;
    size_t i, length;

    in=T_FileStream_open(filename, "rb");
    if(in==NULL) {
        fprintf(stderr, "genccode: unable to open input file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    getOutFilename(filename, destdir, bufferStr, entry, ".S", optFilename);
    out=T_FileStream_open(bufferStr, "w");
    if(out==NULL) {
        fprintf(stderr, "genccode: unable to open output file %s\n", bufferStr);
        exit(U_FILE_ACCESS_ERROR);
    }

    if (outFilePath != NULL) {
        uprv_strcpy(outFilePath, bufferStr);
    }

#if defined (WINDOWS_WITH_GNUC) && U_PLATFORM != U_PF_CYGWIN
    /* Need to fix the file separator character when using MinGW. */
    swapFileSepChar(outFilePath, U_FILE_SEP_CHAR, '/');
#endif

    if(optEntryPoint != NULL) {
        uprv_strcpy(entry, optEntryPoint);
        uprv_strcat(entry, "_dat");
    }

    /* turn dashes or dots in the entry name into underscores */
    length=uprv_strlen(entry);
    for(i=0; i<length; ++i) {
        if(entry[i]=='-' || entry[i]=='.') {
            entry[i]='_';
        }
    }

    sprintf(bufferStr, assemblyHeader[assemblyHeaderIndex].header,
        entry, entry, entry, entry,
        entry, entry, entry, entry);
    T_FileStream_writeLine(out, bufferStr);
    T_FileStream_writeLine(out, assemblyHeader[assemblyHeaderIndex].beginLine);

    for(;;) {
        length=T_FileStream_read(in, buffer, sizeof(buffer));
        if(length==0) {
            break;
        }
        if (length != sizeof(buffer)) {
            /* pad with extra 0's when at the end of the file */
            for(i=0; i < (length % sizeof(uint32_t)); ++i) {
                buffer[length+i] = 0;
            }
        }
        for(i=0; i<(length/sizeof(buffer[0])); i++) {
            column = write32(out, buffer[i], column);
        }
    }

    T_FileStream_writeLine(out, "\n");

    sprintf(bufferStr, assemblyHeader[assemblyHeaderIndex].footer,
        entry, entry, entry, entry,
        entry, entry, entry, entry);
    T_FileStream_writeLine(out, bufferStr);

    if(T_FileStream_error(in)) {
        fprintf(stderr, "genccode: file read error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    if(T_FileStream_error(out)) {
        fprintf(stderr, "genccode: file write error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    T_FileStream_close(out);
    T_FileStream_close(in);
}